

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

int selectOp(int c)

{
  int iVar1;
  
  iVar1 = 0;
  if (c - 0x66U < 6) {
    iVar1 = *(int *)(&DAT_0010a3e8 + (ulong)(c - 0x66U) * 4);
  }
  return iVar1;
}

Assistant:

procedure
int selectOp(int c) {
	variable int riscOp;
	riscOp=0;
	if (c == SYMBOL_EQUALTEST) {
		riscOp = RISC_BEQ;
	} elsif (c == SYMBOL_LESS) {
		riscOp = RISC_BLT;
	} elsif (c == SYMBOL_GREATER) {
		riscOp = RISC_BGT;
	} elsif (c == SYMBOL_LEQ) {
		riscOp = RISC_BLE;
	} elsif (c == SYMBOL_GEQ) {
		riscOp = RISC_BGE;
	} elsif (c == SYMBOL_NOT) {
		riscOp = RISC_BNE;
	}
	return riscOp;
}